

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::operator/=(path *this,path *p)

{
  char cVar1;
  size_type sVar2;
  const_iterator cVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar7;
  char cVar8;
  iterator iter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [64];
  
  cVar8 = (char)this;
  if ((p->_path)._M_string_length == 0) {
    sVar2 = (this->_path)._M_string_length;
    if (sVar2 == 0) {
      return this;
    }
    cVar1 = (this->_path)._M_dataplus._M_p[sVar2 - 1];
    if (cVar1 == '/') {
      return this;
    }
    if (cVar1 == ':') {
      return this;
    }
    std::__cxx11::string::push_back(cVar8);
    return this;
  }
  bVar5 = has_root_directory(p);
  if (bVar5) {
    path<std::__cxx11::string,ghc::filesystem::path>((path *)&local_90,&this->_path,auto_format);
    root_name((path *)&local_b0,this);
    bVar6 = std::operator!=(&local_90,&local_b0);
    if ((bVar6) || (bVar6 = std::operator!=(&p->_path,"/"), bVar6)) {
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      goto LAB_0014923f;
    }
  }
  bVar6 = has_root_name(p);
  if (bVar6) {
    root_name((path *)&iter,p);
    root_name((path *)local_70,this);
    bVar6 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &iter,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)&iter);
    if (bVar5) {
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
    }
    if (bVar6) {
LAB_0014923f:
      std::__cxx11::string::_M_assign((string *)this);
      return this;
    }
  }
  else if (bVar5) {
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  bVar5 = has_root_directory(p);
  if (bVar5) {
    root_name((path *)&iter,this);
    std::__cxx11::string::_M_assign((string *)this);
    std::__cxx11::string::~string((string *)&iter);
  }
  else {
    bVar5 = has_root_directory(this);
    if (((!bVar5) && (bVar5 = has_root_directory(this), bVar5)) ||
       (bVar5 = has_filename(this), bVar5)) {
      std::__cxx11::string::push_back(cVar8);
    }
  }
  begin(&iter,p);
  bVar5 = has_root_name(p);
  if (bVar5) {
    iterator::operator++(&iter);
  }
  bVar5 = true;
  while( true ) {
    end((iterator *)local_70,p);
    uVar4 = local_70._24_8_;
    cVar3 = iter._iter;
    std::__cxx11::string::~string((string *)(local_70 + 0x20));
    if (cVar3._M_current == (char *)uVar4) break;
    iVar7 = extraout_EDX;
    if ((!bVar5) &&
       ((sVar2 = (this->_path)._M_string_length, sVar2 == 0 ||
        ((this->_path)._M_dataplus._M_p[sVar2 - 1] != '/')))) {
      std::__cxx11::string::push_back(cVar8);
      iVar7 = extraout_EDX_00;
    }
    iterator::operator++((iterator *)local_70,&iter,iVar7);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)(local_70 + 0x20));
    bVar5 = false;
  }
  std::__cxx11::string::~string((string *)&iter._current);
  return this;
}

Assistant:

GHC_INLINE path& path::operator/=(const path& p)
{
    if (p.empty()) {
        // was: if ((!has_root_directory() && is_absolute()) || has_filename())
        if (!_path.empty() && _path[_path.length() - 1] != '/' && _path[_path.length() - 1] != ':') {
            _path += '/';
        }
        return *this;
    }
    if ((p.is_absolute() && (_path != root_name() || p._path != "/")) || (p.has_root_name() && p.root_name() != root_name())) {
        assign(p);
        return *this;
    }
    if (p.has_root_directory()) {
        assign(root_name());
    }
    else if ((!has_root_directory() && is_absolute()) || has_filename()) {
        _path += '/';
    }
    auto iter = p.begin();
    bool first = true;
    if (p.has_root_name()) {
        ++iter;
    }
    while (iter != p.end()) {
        if (!first && !(!_path.empty() && _path[_path.length() - 1] == '/')) {
            _path += '/';
        }
        first = false;
        _path += (*iter++).generic_string();
    }
    return *this;
}